

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O2

int gzbuffer(gzFile file,uint size)

{
  int iVar1;
  
  iVar1 = -1;
  if (((file != (gzFile)0x0) && (((*file == 0x79b1 || (*file == 0x1c4f)) && (size != 0)))) &&
     (*(int *)((long)file + 0x18) == 0)) {
    *(uint *)((long)file + 0x1c) = size;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ZEXPORT gzbuffer(gzFile file, unsigned size)
{
    gz_statep state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return -1;

    /* make sure we haven't already allocated memory */
    if (state->size != 0)
        return -1;

    /* check and set requested size */
    if (size == 0)
        return -1;
    state->want = size;
    return 0;
}